

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

PART_EVAL_STATUS get_part_eval_based_on_sub_blk_var(VP16x16 *var_16x16_info,int64_t threshold16)

{
  PART_EVAL_STATUS PVar1;
  long in_RSI;
  long in_RDI;
  int this_8x8_var;
  int split_idx;
  int min_8x8_var;
  int max_8x8_var;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = 0;
  local_18 = 0x7fffffff;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    get_variance((VPartVar *)(in_RDI + 0x50 + (long)local_1c * 0x290));
    local_28 = *(int *)(in_RDI + (long)local_1c * 0x290 + 0x5c);
    local_24 = local_28;
    if (local_28 <= local_14) {
      local_24 = local_14;
    }
    local_14 = local_24;
    if (local_18 <= local_28) {
      local_28 = local_18;
    }
    local_18 = local_28;
  }
  PVar1 = '\x02';
  if (in_RSI * 4 < (long)(local_14 - local_18)) {
    PVar1 = '\x01';
  }
  return PVar1;
}

Assistant:

static inline PART_EVAL_STATUS get_part_eval_based_on_sub_blk_var(
    VP16x16 *var_16x16_info, int64_t threshold16) {
  int max_8x8_var = 0, min_8x8_var = INT_MAX;
  for (int split_idx = 0; split_idx < 4; split_idx++) {
    get_variance(&var_16x16_info->split[split_idx].part_variances.none);
    int this_8x8_var =
        var_16x16_info->split[split_idx].part_variances.none.variance;
    max_8x8_var = AOMMAX(this_8x8_var, max_8x8_var);
    min_8x8_var = AOMMIN(this_8x8_var, min_8x8_var);
  }
  // If the difference between maximum and minimum sub-block variances is high,
  // then only evaluate PARTITION_SPLIT for the 16x16 block. Otherwise, evaluate
  // only PARTITION_NONE. The shift factor for threshold16 has been derived
  // empirically.
  return ((max_8x8_var - min_8x8_var) > (threshold16 << 2))
             ? PART_EVAL_ONLY_SPLIT
             : PART_EVAL_ONLY_NONE;
}